

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall
glslang::HlslGrammar::acceptAssignmentExpression(HlslGrammar *this,TIntermTyped **node)

{
  bool bVar1;
  EHlslTokenClass op;
  TOperator op_00;
  TIntermTyped *pTVar2;
  char *pcVar3;
  char *pcVar4;
  TSourceLoc *pTVar5;
  HlslParseContext *this_00;
  _func_int **pp_Var6;
  TIntermTyped *rightNode;
  TSourceLoc loc;
  TIntermTyped *local_40;
  TSourceLoc local_38;
  
  bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  if (bVar1) {
    bVar1 = acceptInitializer(this,node);
    if (bVar1) {
      return true;
    }
    this_00 = this->parseContext;
    pp_Var6 = (this_00->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar3 = "initializer";
  }
  else {
    bVar1 = acceptConditionalExpression(this,node);
    if (!bVar1) {
      return false;
    }
    op = HlslTokenStream::peek(&this->super_HlslTokenStream);
    op_00 = HlslOpMap::assignment(op);
    if (op_00 == EOpNull) {
      return true;
    }
    local_38.column = (this->super_HlslTokenStream).token.loc.column;
    local_38._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
    local_38.name = (this->super_HlslTokenStream).token.loc.name;
    local_38.string = (this->super_HlslTokenStream).token.loc.string;
    local_38.line = (this->super_HlslTokenStream).token.loc.line;
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    local_40 = (TIntermTyped *)0x0;
    bVar1 = acceptAssignmentExpression(this,&local_40);
    this_00 = this->parseContext;
    if (bVar1) {
      pTVar2 = HlslParseContext::handleAssign(this_00,&local_38,op_00,*node,local_40);
      *node = pTVar2;
      pTVar2 = HlslParseContext::handleLvalue(this->parseContext,&local_38,"assign",node);
      *node = pTVar2;
      if (pTVar2 != (TIntermTyped *)0x0) {
        HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokComma);
        return true;
      }
      this_00 = this->parseContext;
      pp_Var6 = (this_00->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar4 = "could not create assignment";
      pcVar3 = "";
      pTVar5 = &local_38;
      goto LAB_004284bb;
    }
    pp_Var6 = (this_00->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar3 = "assignment expression";
  }
  pTVar5 = &(this->super_HlslTokenStream).token.loc;
  pcVar4 = "Expected";
LAB_004284bb:
  (*pp_Var6[0x2d])(this_00,pTVar5,pcVar4,pcVar3,"");
  return false;
}

Assistant:

bool HlslGrammar::acceptAssignmentExpression(TIntermTyped*& node)
{
    // initializer
    if (peekTokenClass(EHTokLeftBrace)) {
        if (acceptInitializer(node))
            return true;

        expected("initializer");
        return false;
    }

    // conditional_expression
    if (! acceptConditionalExpression(node))
        return false;

    // assignment operation?
    TOperator assignOp = HlslOpMap::assignment(peek());
    if (assignOp == EOpNull)
        return true;

    // assign_op
    TSourceLoc loc = token.loc;
    advanceToken();

    // conditional_expression assign_op conditional_expression ...
    // Done by recursing this function, which automatically
    // gets the right-to-left associativity.
    TIntermTyped* rightNode = nullptr;
    if (! acceptAssignmentExpression(rightNode)) {
        expected("assignment expression");
        return false;
    }

    node = parseContext.handleAssign(loc, assignOp, node, rightNode);
    node = parseContext.handleLvalue(loc, "assign", node);

    if (node == nullptr) {
        parseContext.error(loc, "could not create assignment", "", "");
        return false;
    }

    if (! peekTokenClass(EHTokComma))
        return true;

    return true;
}